

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  Location loc;
  Var var;
  long *local_c0;
  Location local_b8;
  Var local_90;
  Location local_48;
  
  RVar1 = Expect(this,Lpar);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    GetToken((Token *)&local_90,this);
    local_b8.field_1.field_1.offset = local_90.loc.field_1.field_1.offset;
    local_b8.field_1._8_8_ = local_90.loc.field_1._8_8_;
    local_b8.filename.data_ = local_90.loc.filename.data_;
    local_b8.filename.size_ = local_90.loc.filename.size_;
    if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      RVar1 = Expect(this,Start);
      EVar2 = Error;
      if (RVar1.enum_ != Error) {
        local_48.field_1.field_0.line = 0;
        local_48.field_1._4_8_ = 0;
        local_48.filename.data_ = (char *)0x0;
        local_48.filename.size_._0_4_ = 0;
        local_48.filename.size_._4_4_ = 0;
        Var::Var(&local_90,0xffffffff,&local_48);
        RVar1 = ParseVar(this,&local_90);
        EVar2 = Error;
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
                      ((wabt *)&local_c0,&local_90,&local_b8);
            Module::AppendField(module,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                        *)&local_c0);
            if (local_c0 != (long *)0x0) {
              (**(code **)(*local_c0 + 8))();
            }
            local_c0 = (long *)0x0;
            EVar2 = Ok;
          }
        }
        Var::~Var(&local_90);
      }
    }
    else {
      Error(this,0x18766a);
      EVar2 = Error;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(MakeUnique<StartModuleField>(var, loc));
  return Result::Ok;
}